

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall tchecker::clockbounds::df_solver_t::~df_solver_t(df_solver_t *this)

{
  df_solver_t *this_local;
  
  if (this->_L != (db_t *)0x0) {
    operator_delete__(this->_L);
  }
  if (this->_U != (db_t *)0x0) {
    operator_delete__(this->_U);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->_loc_pid);
  return;
}

Assistant:

df_solver_t::~df_solver_t()
{
  delete[] _L;
  delete[] _U;
}